

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

void __thiscall
cfd::core::ConfidentialNonce::ConfidentialNonce(ConfidentialNonce *this,Pubkey *pubkey)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_28;
  
  Pubkey::GetData((ByteData *)&_Stack_28,pubkey);
  ConfidentialNonce(this,(ByteData *)&_Stack_28);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_28);
  return;
}

Assistant:

ConfidentialNonce::ConfidentialNonce(const Pubkey &pubkey)
    : ConfidentialNonce(pubkey.GetData()) {
  // do nothing
}